

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O1

_Bool set_static_cache(staticCache *Cache,char *label,IP *ip)

{
  IP *pIVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uchar uVar5;
  undefined7 uVar6;
  static_record_data *psVar7;
  static_record_data *psVar8;
  static_record_data *psVar9;
  size_t sVar10;
  char *pcVar11;
  byte unaff_BPL;
  
  if (Cache->is_init == true) {
    psVar7 = get_static_cache(Cache,label);
    if (psVar7 == (static_record_data *)0x0) {
      uVar2 = Cache->top;
      if (uVar2 == Cache->size) {
        unaff_BPL = 0;
        log_log(4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/cache.c"
                ,0x2be,"static cache overflow. top == %d",(ulong)uVar2);
      }
      else {
        sVar10 = strlen(label);
        psVar9 = Cache->data;
        uVar3 = *(undefined8 *)((long)&ip->addr + 8);
        uVar5 = ip->type;
        uVar6 = *(undefined7 *)&ip->field_0x11;
        uVar4 = *(undefined8 *)&ip->field_0x18;
        pIVar1 = &psVar9[(int)uVar2].ip;
        *(undefined8 *)&pIVar1->addr = *(undefined8 *)&ip->addr;
        *(undefined8 *)((long)&pIVar1->addr + 8) = uVar3;
        psVar9 = psVar9 + (int)uVar2;
        (psVar9->ip).type = uVar5;
        *(undefined7 *)&(psVar9->ip).field_0x11 = uVar6;
        *(undefined8 *)(&(psVar9->ip).type + 8) = uVar4;
        sVar10 = (size_t)((int)sVar10 + 1);
        pcVar11 = (char *)malloc(sVar10);
        psVar9 = Cache->data;
        psVar9[(int)uVar2].label = pcVar11;
        memcpy(pcVar11,label,sVar10);
        psVar9[(int)uVar2].next = (static_record_data *)0x0;
        set_hashnode(&Cache->table,label,psVar9 + (int)uVar2,(_Bool *)0x0);
        Cache->top = Cache->top + 1;
        unaff_BPL = 1;
      }
    }
    else {
      pcVar11 = psVar7->label;
      psVar9 = psVar7;
      do {
        psVar8 = psVar9;
        psVar9 = psVar8->next;
      } while (psVar9 != (static_record_data *)0x0);
      psVar9 = (static_record_data *)malloc(0x40);
      psVar8->next = psVar9;
      uVar3 = *(undefined8 *)((long)&ip->addr + 8);
      uVar5 = ip->type;
      uVar6 = *(undefined7 *)&ip->field_0x11;
      uVar4 = *(undefined8 *)&ip->field_0x18;
      *(undefined8 *)&(psVar9->ip).addr = *(undefined8 *)&ip->addr;
      *(undefined8 *)((long)&(psVar9->ip).addr + 8) = uVar3;
      (psVar9->ip).type = uVar5;
      *(undefined7 *)&(psVar9->ip).field_0x11 = uVar6;
      *(undefined8 *)&(psVar9->ip).field_0x18 = uVar4;
      psVar9->label = pcVar11;
      psVar9->next = (static_record_data *)0x0;
    }
    if (psVar7 == (static_record_data *)0x0) goto LAB_0010335e;
  }
  unaff_BPL = 0;
LAB_0010335e:
  return (_Bool)(unaff_BPL & 1);
}

Assistant:

bool set_static_cache(struct staticCache* Cache,const char* label,const struct IP*ip){
  if(Cache->is_init==true){
    struct static_record_data* data=NULL;
    char* first_label = NULL;
    if ( (data=(get_static_cache(Cache,label))) !=NULL){
        //重复
      first_label = data->label;
      while(data->next){
        data= data->next;
      }
      data->next = (struct static_record_data*)malloc(sizeof(struct static_record_data));
      data =data->next;
      memcpy(&data->ip,ip,sizeof(struct IP));
      // memcpy_s(&data->ip,sizeof(struct IP),ip,sizeof(struct IP));
      data->label = first_label;
      data->next=NULL;
    }else{
      int len = strlen(label) + 1;//记得加1
      int top = Cache->top;
      if(top==Cache->size){
        log_error("static cache overflow. top == %d",Cache->top);
        return false;
      }
      memcpy(&Cache->data[top].ip,ip,sizeof(struct IP));
      // memcpy_s(&Cache->data[top].ip,sizeof(struct IP),ip,sizeof(struct IP));
      Cache->data[top].label = (char*)malloc(len);
      memcpy(Cache->data[top].label,label,len);
      // memcpy_s(Cache->data[top].label,len,label,len);
      Cache->data[top].next=NULL;
      set_hashnode(&Cache->table,(void*)label,&Cache->data[top],NULL);
      Cache->top+=1;
      return true;
    }
  }
  return false;
}